

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChParticleCloud::IntLoadResidual_Mv
          (ChParticleCloud *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  char *__function;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ChVector<double> Iw;
  double local_98 [3];
  ChVector<double> local_80;
  double *local_68;
  undefined8 local_60;
  ChVectorDynamic<> *local_50;
  ulong local_48;
  long local_38;
  
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar17 = 0;
    uVar15 = off + 3;
    do {
      uVar18 = off + (int)uVar17 * 6;
      uVar16 = (ulong)uVar18;
      lVar10 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (lVar10 <= (long)uVar16) {
LAB_00538b6c:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      lVar11 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (lVar11 <= (long)uVar16) {
LAB_00538b4d:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar12 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = pdVar12[uVar16];
      pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar13[uVar16];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = c * (this->particle_mass).mass;
      auVar1 = vfmadd213sd_fma(auVar20,auVar24,auVar1);
      pdVar13[uVar16] = auVar1._0_8_;
      uVar16 = (ulong)(uVar18 + 1);
      if (lVar10 <= (long)uVar16) goto LAB_00538b6c;
      if (lVar11 <= (long)uVar16) goto LAB_00538b4d;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = pdVar12[uVar16];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar13[uVar16];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = c * (this->particle_mass).mass;
      auVar1 = vfmadd213sd_fma(auVar21,auVar25,auVar2);
      pdVar13[uVar16] = auVar1._0_8_;
      uVar16 = (ulong)(uVar18 + 2);
      if (lVar10 <= (long)uVar16) goto LAB_00538b6c;
      if (lVar11 <= (long)uVar16) goto LAB_00538b4d;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = pdVar12[uVar16];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pdVar13[uVar16];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = c * (this->particle_mass).mass;
      auVar1 = vfmadd213sd_fma(auVar22,auVar26,auVar3);
      pdVar13[uVar16] = auVar1._0_8_;
      uVar16 = (ulong)(uVar18 + 3);
      local_68 = pdVar12 + uVar16;
      local_60 = 3;
      local_50 = w;
      local_48 = uVar16;
      local_38 = lVar10;
      if (lVar10 + -3 < (long)uVar16) {
        __function = 
        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
LAB_00538bb7:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
      }
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_80,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68,(type *)0x0);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_80.m_data[0];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           local_80.m_data[1] *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 8);
      auVar1 = vfmadd231sd_fma(auVar27,auVar19,auVar4);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_80.m_data[2];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x10);
      auVar1 = vfmadd231sd_fma(auVar1,auVar28,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x18);
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           local_80.m_data[1] *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
      auVar20 = vfmadd231sd_fma(auVar29,auVar19,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x28);
      auVar20 = vfmadd231sd_fma(auVar20,auVar28,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           local_80.m_data[1] *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
      auVar24 = vfmadd231sd_fma(auVar23,auVar19,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x40);
      auVar24 = vfmadd231sd_fma(auVar24,auVar28,auVar9);
      local_98[0] = auVar1._0_8_ * c;
      local_98[1] = auVar20._0_8_ * c;
      local_98[2] = auVar24._0_8_ * c;
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < (long)uVar16) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00538bb7;
      }
      pdVar12 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar14 = 3;
      if ((((ulong)(pdVar12 + uVar16) & 7) == 0) &&
         (uVar14 = (ulong)(-((uint)((ulong)(pdVar12 + uVar16) >> 3) & 0x1fffffff) & 7), 2 < uVar14))
      {
        uVar14 = 3;
      }
      if (uVar14 != 0) {
        uVar16 = 0;
        do {
          pdVar12[uVar15 + uVar16] = local_98[uVar16] + pdVar12[uVar15 + uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      if (uVar14 < 3) {
        do {
          pdVar12[uVar15 + uVar14] = local_98[uVar14] + pdVar12[uVar15 + uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar14 != 3);
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      uVar15 = uVar15 + 6;
    } while (uVar17 < (ulong)((long)(this->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ChParticleCloud::IntLoadResidual_Mv(const unsigned int off,      // offset in R residual
                                           ChVectorDynamic<>& R,        // result: the R residual, R += c*M*v
                                           const ChVectorDynamic<>& w,  // the w vector
                                           const double c               // a scaling factor
                                           ) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        R(off + 6 * j + 0) += c * GetMass() * w(off + 6 * j + 0);
        R(off + 6 * j + 1) += c * GetMass() * w(off + 6 * j + 1);
        R(off + 6 * j + 2) += c * GetMass() * w(off + 6 * j + 2);
        ChVector<> Iw = c * (particle_mass.GetBodyInertia() * ChVector<>(w.segment(off + 6 * j + 3, 3)));
        R.segment(off + 6 * j + 3, 3) += Iw.eigen();
    }
}